

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server_test.cpp
# Opt level: O1

string * GetFile_abi_cxx11_(void)

{
  string *in_RDI;
  string str;
  ifstream t;
  size_type *local_238;
  size_type local_230;
  size_type local_228;
  undefined8 uStack_220;
  long local_218 [29];
  undefined8 auStack_130 [36];
  
  std::ifstream::ifstream(local_218,"logo.png",_S_in);
  local_238 = &local_228;
  std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
            ((string *)&local_238,
             *(undefined8 *)((long)auStack_130 + *(long *)(local_218[0] + -0x18)),0xffffffff,0,
             0xffffffff);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  if (local_238 == &local_228) {
    (in_RDI->field_2)._M_allocated_capacity = local_228;
    *(undefined8 *)((long)&in_RDI->field_2 + 8) = uStack_220;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = (pointer)local_238;
    (in_RDI->field_2)._M_allocated_capacity = local_228;
  }
  in_RDI->_M_string_length = local_230;
  std::ifstream::~ifstream(local_218);
  return in_RDI;
}

Assistant:

std::string GetFile() {
    std::ifstream t("logo.png");
    std::string str((std::istreambuf_iterator<char>(t)),
        std::istreambuf_iterator<char>());
    return std::move(str);
}